

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

aiPropertyStore * aiCreatePropertyStore(void)

{
  aiPropertyStore *__s;
  
  __s = (aiPropertyStore *)operator_new(0xc0);
  memset(__s,0,0xc0);
  *(aiPropertyStore **)(__s + 0x18) = __s + 8;
  *(aiPropertyStore **)(__s + 0x20) = __s + 8;
  *(undefined8 *)(__s + 0x28) = 0;
  *(undefined4 *)(__s + 0x38) = 0;
  *(undefined8 *)(__s + 0x40) = 0;
  *(aiPropertyStore **)(__s + 0x48) = __s + 0x38;
  *(aiPropertyStore **)(__s + 0x50) = __s + 0x38;
  *(undefined8 *)(__s + 0x58) = 0;
  *(undefined4 *)(__s + 0x68) = 0;
  *(undefined8 *)(__s + 0x70) = 0;
  *(aiPropertyStore **)(__s + 0x78) = __s + 0x68;
  *(aiPropertyStore **)(__s + 0x80) = __s + 0x68;
  *(undefined8 *)(__s + 0x88) = 0;
  *(undefined4 *)(__s + 0x98) = 0;
  *(undefined8 *)(__s + 0xa0) = 0;
  *(aiPropertyStore **)(__s + 0xa8) = __s + 0x98;
  *(aiPropertyStore **)(__s + 0xb0) = __s + 0x98;
  *(undefined8 *)(__s + 0xb8) = 0;
  return __s;
}

Assistant:

ASSIMP_API aiPropertyStore* aiCreatePropertyStore(void)
{
    return reinterpret_cast<aiPropertyStore*>( new PropertyMap() );
}